

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

void __thiscall
math::wide_integer::uintwide_t<256U,_unsigned_int,_void,_false>::shr<unsigned_long>
          (uintwide_t<256U,_unsigned_int,_void,_false> *this,unsigned_long n)

{
  sbyte sVar1;
  bool bVar2;
  limb_type val;
  uint uVar3;
  ulong uVar4;
  const_iterator puVar5;
  uint *puVar6;
  uint *last;
  iterator puVar7;
  reference pvVar8;
  uint local_94;
  local_integral_type left_shift_previous_value;
  uint local_54;
  reverse_iterator rStack_50;
  value_type_conflict t;
  reverse_iterator<unsigned_int_*> local_48;
  reverse_iterator r_ai;
  limb_type part_from_previous_value;
  uint_fast16_t right_shift_amount;
  ulong local_28;
  unsigned_long local_20;
  unsigned_long offset;
  unsigned_long n_local;
  uintwide_t<256U,_unsigned_int,_void,_false> *this_local;
  
  local_28 = n >> 5;
  right_shift_amount = 8;
  offset = n;
  n_local = (unsigned_long)this;
  local_20 = detail::min_unsafe<unsigned_long>(&local_28,&right_shift_amount);
  uVar4 = offset & 0x1f;
  if ((int)local_20 != 0) {
    puVar5 = detail::array_detail::array<unsigned_int,_8UL>::cbegin
                       ((array<unsigned_int,_8UL> *)this);
    puVar6 = detail::advance_and_point<unsigned_int_const*,unsigned_int>(puVar5,(uint)local_20);
    puVar5 = detail::array_detail::array<unsigned_int,_8UL>::cbegin
                       ((array<unsigned_int,_8UL> *)this);
    last = detail::advance_and_point<unsigned_int_const*,unsigned_int>(puVar5,8);
    puVar7 = detail::array_detail::array<unsigned_int,_8UL>::begin((array<unsigned_int,_8UL> *)this)
    ;
    detail::copy_unsafe<unsigned_int_const*,unsigned_int*>(puVar6,last,puVar7);
    puVar7 = detail::array_detail::array<unsigned_int,_8UL>::begin((array<unsigned_int,_8UL> *)this)
    ;
    puVar6 = detail::advance_and_point<unsigned_int*,unsigned_int>(puVar7,8 - (int)local_20);
    puVar7 = detail::array_detail::array<unsigned_int,_8UL>::end((array<unsigned_int,_8UL> *)this);
    val = right_shift_fill_value(this);
    detail::fill_unsafe<unsigned_int*,unsigned_int>(puVar6,puVar7,val);
  }
  if (uVar4 != 0) {
    bVar2 = is_neg<false>(this,(enable_if_t<(_false),_int> *)0x0);
    sVar1 = (sbyte)uVar4;
    if (bVar2) {
      local_94 = std::numeric_limits<unsigned_int>::max();
      local_94 = local_94 << (0x20U - sVar1 & 0x1f);
    }
    else {
      local_94 = 0;
    }
    r_ai.current._4_4_ = local_94;
    puVar7 = detail::array_detail::array<unsigned_int,_8UL>::begin((array<unsigned_int,_8UL> *)this)
    ;
    puVar6 = detail::advance_and_point<unsigned_int*,long>(puVar7,8 - local_20);
    detail::iterator_detail::reverse_iterator<unsigned_int_*>::reverse_iterator(&local_48,puVar6);
    while( true ) {
      rStack_50 = detail::array_detail::array<unsigned_int,_8UL>::rend
                            ((array<unsigned_int,_8UL> *)this);
      bVar2 = detail::iterator_detail::operator!=(&local_48,&stack0xffffffffffffffb0);
      if (!bVar2) break;
      pvVar8 = detail::iterator_detail::reverse_iterator<unsigned_int_*>::operator*(&local_48);
      local_54 = *pvVar8;
      uVar3 = local_54 >> sVar1 | r_ai.current._4_4_;
      left_shift_previous_value =
           (local_integral_type)
           detail::iterator_detail::reverse_iterator<unsigned_int_*>::operator++(&local_48,0);
      pvVar8 = detail::iterator_detail::reverse_iterator<unsigned_int_*>::operator*
                         ((reverse_iterator<unsigned_int_*> *)&left_shift_previous_value);
      *pvVar8 = uVar3;
      r_ai.current._4_4_ = local_54 << (0x20U - sVar1 & 0x1f);
    }
  }
  return;
}

Assistant:

constexpr auto shr(IntegralType n) -> void
    {
      const auto offset =
        (detail::min_unsafe)(static_cast<unsigned_fast_type>(static_cast<unsigned_fast_type>(n) / static_cast<unsigned_fast_type>(std::numeric_limits<limb_type>::digits)),
                             static_cast<unsigned_fast_type>(number_of_limbs));

      const auto right_shift_amount = static_cast<std::uint_fast16_t>(static_cast<unsigned_fast_type>(n) % static_cast<unsigned_fast_type>(std::numeric_limits<limb_type>::digits));

      if(static_cast<size_t>(offset) > static_cast<size_t>(UINT8_C(0)))
      {
        detail::copy_unsafe(detail::advance_and_point(values.cbegin(), static_cast<size_t>(offset)),
                            detail::advance_and_point(values.cbegin(), static_cast<size_t>(number_of_limbs)),
                            values.begin());

        detail::fill_unsafe(detail::advance_and_point(values.begin(), static_cast<size_t>(static_cast<size_t>(number_of_limbs) - static_cast<size_t>(offset))),
                            values.end(),
                            right_shift_fill_value());
      }

      using local_integral_type = unsigned_fast_type;

      if(right_shift_amount != static_cast<local_integral_type>(UINT8_C(0)))
      {
        auto part_from_previous_value =
          static_cast<limb_type>
          (
            (!is_neg(*this))
              ? static_cast<limb_type>(UINT8_C(0))
              : static_cast<limb_type>((std::numeric_limits<limb_type>::max)() << static_cast<std::uint_fast16_t>(static_cast<std::uint_fast16_t>(std::numeric_limits<limb_type>::digits) - right_shift_amount))
          );

        auto r_ai =
          static_cast<reverse_iterator>
          (
            detail::advance_and_point
            (
              values.begin(),
              static_cast<signed_fast_type>
              (
                static_cast<unsigned_fast_type>(number_of_limbs) - offset
              )
            )
          );

        while(r_ai != values.rend()) // NOLINT(altera-id-dependent-backward-branch)
        {
          const auto t = *r_ai;

          *r_ai++ = static_cast<limb_type>(static_cast<limb_type>(t >> static_cast<local_integral_type>(right_shift_amount)) | part_from_previous_value);

          const auto left_shift_previous_value =
            static_cast<local_integral_type>
            (
              static_cast<unsigned_fast_type>
              (
                  static_cast<std::int_fast32_t>(std::numeric_limits<limb_type>::digits)
                - static_cast<std::int_fast32_t>(right_shift_amount)
              )
            );

          part_from_previous_value = static_cast<limb_type>(t << left_shift_previous_value);
        }
      }
    }